

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::Runway> metaf::Runway::fromString(string *s,bool enableRwy)

{
  bool bVar1;
  char *pcVar2;
  uint *puVar3;
  ulong uVar4;
  Designator *pDVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar6;
  byte in_SIL;
  ulong in_RDI;
  optional<metaf::Runway> oVar7;
  undefined1 auVar8 [16];
  optional<metaf::Runway::Designator> designator;
  Runway runway;
  uint dsgPos;
  optional<unsigned_int> rwyNum;
  uint numPos;
  Runway *in_stack_ffffffffffffffa8;
  optional<metaf::Runway> *in_stack_ffffffffffffffb0;
  char in_stack_ffffffffffffffbf;
  Runway local_34;
  uint local_2c;
  _Optional_payload_base<unsigned_int> local_28;
  int local_20;
  byte local_19;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  undefined4 in_stack_fffffffffffffff8;
  undefined1 uVar9;
  undefined4 in_stack_fffffffffffffffc;
  
  local_19 = in_SIL & 1;
  auVar8 = std::__cxx11::string::length();
  uVar6 = auVar8._8_8_;
  if (auVar8._0_8_ < 3) {
    in_stack_fffffffffffffff4 = 0;
    in_stack_fffffffffffffff8 = 0;
    uVar9 = 0;
  }
  else {
    auVar8 = std::__cxx11::string::operator[](in_RDI);
    uVar6 = auVar8._8_8_;
    if (*auVar8._0_8_ == 'R') {
      local_20 = 1;
      if ((local_19 & 1) != 0) {
        pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI);
        if (*pcVar2 == 'W') {
          pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI);
          if (*pcVar2 == 'Y') {
            local_20 = local_20 + 2;
          }
        }
      }
      local_28 = (_Optional_payload_base<unsigned_int>)
                 strToUint((string *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),in_RDI);
      uVar9 = (undefined1)in_stack_fffffffffffffffc;
      bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x24235a);
      if (bVar1) {
        local_2c = local_20 + 2;
        auVar8 = std::__cxx11::string::length();
        uVar6 = auVar8._8_8_;
        if ((ulong)(local_2c + 1) < auVar8._0_8_) {
          in_stack_fffffffffffffff4 = 0;
          in_stack_fffffffffffffff8 = 0;
          uVar9 = 0;
        }
        else {
          Runway(&local_34);
          puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x2423cb);
          local_34.rNumber = *puVar3;
          uVar4 = std::__cxx11::string::length();
          if (local_2c < uVar4) {
            std::__cxx11::string::operator[](in_RDI);
            designatorFromChar(in_stack_ffffffffffffffbf);
            bVar1 = std::optional<metaf::Runway::Designator>::has_value
                              ((optional<metaf::Runway::Designator> *)0x24240b);
            if (!bVar1) {
              in_stack_fffffffffffffff4 = 0;
              in_stack_fffffffffffffff8 = 0;
              uVar9 = 0;
              uVar6 = extraout_RDX_00;
              goto LAB_00242446;
            }
            pDVar5 = std::optional<metaf::Runway::Designator>::operator*
                               ((optional<metaf::Runway::Designator> *)0x242431);
            local_34.rDesignator = *pDVar5;
          }
          std::optional<metaf::Runway>::optional<metaf::Runway,_true>
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
          uVar6 = extraout_RDX_01;
        }
      }
      else {
        in_stack_fffffffffffffff4 = 0;
        in_stack_fffffffffffffff8 = 0;
        uVar9 = 0;
        uVar6 = extraout_RDX;
      }
    }
    else {
      in_stack_fffffffffffffff4 = 0;
      in_stack_fffffffffffffff8 = 0;
      uVar9 = 0;
    }
  }
LAB_00242446:
  oVar7.super__Optional_base<metaf::Runway,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Runway>._M_payload._M_value.rDesignator =
       in_stack_fffffffffffffff8;
  oVar7.super__Optional_base<metaf::Runway,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Runway>._M_payload._M_value.rNumber =
       in_stack_fffffffffffffff4;
  oVar7.super__Optional_base<metaf::Runway,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Runway>._8_4_ =
       (undefined4)CONCAT71((int7)((ulong)uVar6 >> 8),uVar9);
  return (optional<metaf::Runway>)
         oVar7.super__Optional_base<metaf::Runway,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Runway>;
}

Assistant:

std::optional<Runway> Runway::fromString(const std::string & s, bool enableRwy) {
	//static const std::regex rgx("R(?:WY)?(\\d\\d)([RLC])?");
	static const std::optional<Runway> error;
	if (s.length() < 3) return error;
	if (s[0] != 'R') return error;
	auto numPos = 1u;
	if (enableRwy && s[1] == 'W' && s[2] == 'Y') numPos += 2;
	const auto rwyNum = strToUint(s, numPos, 2);
	if (!rwyNum.has_value()) return error;
	const auto dsgPos = numPos + 2;
	if (s.length() > dsgPos + 1) return error;
	Runway runway;
	runway.rNumber = *rwyNum;
	if ( s.length() > dsgPos) {
		const auto designator = designatorFromChar(s[dsgPos]);
		if (!designator.has_value()) return error;
		runway.rDesignator = *designator;
	}
	return runway;
}